

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O1

int sat_solver3_solve_lexsat(sat_solver3 *s,int *pLits,int nLits)

{
  int i;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  if (nLits < 1) {
    __assert_fail("nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver3.c"
                  ,0x819,"int sat_solver3_solve_lexsat(sat_solver3 *, int *, int)");
  }
  uVar10 = (ulong)(uint)nLits;
  uVar3 = 0;
  do {
    uVar6 = pLits[uVar3];
    if ((int)uVar6 < 0) goto LAB_008b3c64;
    s->polarity[uVar6 >> 1] = ~(byte)uVar6 & 1;
    uVar3 = uVar3 + 1;
  } while (uVar10 != uVar3);
  iVar1 = sat_solver3_solve_internal(s);
  if (iVar1 != 1) {
    return iVar1;
  }
  uVar3 = 0;
  do {
    uVar6 = pLits[uVar3];
    if ((int)uVar6 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (s->size <= (int)(uVar6 >> 1)) {
      __assert_fail("v >= 0 && v < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver3.h"
                    ,0xd5,"int sat_solver3_var_literal(sat_solver3 *, int)");
    }
    uVar7 = uVar3;
  } while ((uVar6 == ((uint)(s->model[uVar6 >> 1] != 1) | uVar6 & 0x7ffffffe)) &&
          (uVar3 = uVar3 + 1, uVar7 = uVar10, uVar10 != uVar3));
  uVar6 = (uint)uVar7;
  if (uVar6 == nLits) {
    return 1;
  }
  uVar7 = uVar7 & 0xffffffff;
  uVar9 = uVar6 + 1;
  uVar3 = (ulong)uVar9;
  iVar1 = sat_solver3_push(s,*pLits);
  if (iVar1 == 0) {
    bVar11 = false;
  }
  else {
    uVar10 = 0;
    do {
      uVar5 = uVar10;
      if (uVar3 - 1 == uVar5) break;
      iVar1 = sat_solver3_push(s,pLits[uVar5 + 1]);
      uVar10 = uVar5 + 1;
    } while (iVar1 != 0);
    bVar11 = uVar7 <= uVar5;
  }
  uVar2 = 0xff;
  if (bVar11) {
    uVar2 = sat_solver3_solve_internal(s);
  }
  cVar8 = (char)uVar2;
  if (cVar8 == -1) {
    if (pLits[uVar7] < 0) {
LAB_008b3c64:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((pLits[uVar7] & 1U) == 0) {
      __assert_fail("Abc_LitIsCompl(pLits[iLitFail])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver3.c"
                    ,0x83c,"int sat_solver3_solve_lexsat(sat_solver3 *, int *, int)");
    }
    sat_solver3_pop(s);
    if (pLits[uVar7] < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    uVar2 = pLits[uVar7] ^ 1;
    pLits[uVar7] = uVar2;
    iVar1 = sat_solver3_push(s,uVar2);
    if (iVar1 == 0) {
      puts("sat_solver3_solve_lexsat(): A satisfying assignment should exist.");
    }
    if ((int)uVar9 < nLits) {
      puVar4 = (uint *)(pLits + uVar3);
      do {
        if ((int)*puVar4 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x133,"int Abc_LitRegular(int)");
        }
        *puVar4 = *puVar4 | 1;
        puVar4 = puVar4 + 1;
        uVar2 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar2;
      } while ((int)uVar2 < nLits);
    }
    cVar8 = '\x01';
  }
  else if ((uVar2 & 0xff) != 1) goto LAB_008b3bba;
  if ((int)uVar9 < nLits) {
    iVar1 = sat_solver3_solve_lexsat(s,pLits + uVar7 + 1,~uVar6 + nLits);
    cVar8 = (char)iVar1;
  }
LAB_008b3bba:
  if (-1 < (int)uVar6) {
    iVar1 = uVar6 + 1;
    do {
      sat_solver3_pop(s);
      iVar1 = iVar1 + -1;
    } while (0 < iVar1);
  }
  return (int)cVar8;
}

Assistant:

int sat_solver3_solve_lexsat( sat_solver3* s, int * pLits, int nLits )
{
    int i, iLitFail = -1;
    lbool status;
    assert( nLits > 0 );
    // help the SAT solver by setting desirable polarity
    sat_solver3_set_literal_polarity( s, pLits, nLits );
    // check if there exists a satisfying assignment
    status = sat_solver3_solve_internal( s );
    if ( status != l_True ) // no assignment
        return status;
    // there is at least one satisfying assignment
    assert( status == l_True );
    // find the first mismatching literal
    for ( i = 0; i < nLits; i++ )
        if ( pLits[i] != sat_solver3_var_literal(s, Abc_Lit2Var(pLits[i])) )
            break;
    if ( i == nLits ) // no mismatch - the current assignment is the minimum one!
        return l_True;
    // mismatch happens in literal i
    iLitFail = i;
    // create assumptions up to this literal (as in pLits) - including this literal!
    for ( i = 0; i <= iLitFail; i++ )
        if ( !sat_solver3_push(s, pLits[i]) ) // can become UNSAT while adding the last assumption
            break;
    if ( i < iLitFail + 1 ) // the solver became UNSAT while adding assumptions
        status = l_False;
    else // solve under the assumptions
        status = sat_solver3_solve_internal( s );
    if ( status == l_True )
    {
        // we proved that there is a sat assignment with literal (iLitFail) having polarity as in pLits
        // continue solving recursively
        if ( iLitFail + 1 < nLits )
            status = sat_solver3_solve_lexsat( s, pLits + iLitFail + 1, nLits - iLitFail - 1 );
    }
    else if ( status == l_False )
    {
        // we proved that there is no assignment with iLitFail having polarity as in pLits
        assert( Abc_LitIsCompl(pLits[iLitFail]) ); // literal is 0 
        // (this assert may fail only if there is a sat assignment smaller than one originally given in pLits)
        // now we flip this literal (make it 1), change the last assumption
        // and contiue looking for the 000...0-assignment of other literals
        sat_solver3_pop( s );
        pLits[iLitFail] = Abc_LitNot(pLits[iLitFail]);
        if ( !sat_solver3_push(s, pLits[iLitFail]) )
            printf( "sat_solver3_solve_lexsat(): A satisfying assignment should exist.\n" ); // because we know that the problem is satisfiable
        // update other literals to be 000...0
        for ( i = iLitFail + 1; i < nLits; i++ )
            pLits[i] = Abc_LitNot( Abc_LitRegular(pLits[i]) );
        // continue solving recursively
        if ( iLitFail + 1 < nLits )
            status = sat_solver3_solve_lexsat( s, pLits + iLitFail + 1, nLits - iLitFail - 1 );
        else
            status = l_True;
    }
    // undo the assumptions
    for ( i = iLitFail; i >= 0; i-- )
        sat_solver3_pop( s );
    return status;
}